

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamEuler::BuildBeam
          (ChBuilderBeamEuler *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionEuler> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,ChVector<double> *Ydir)

{
  undefined8 *puVar1;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ChMesh *pCVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  ChNodeFEAxyzrot *pCVar10;
  pointer psVar11;
  long lVar12;
  ChVector<double> *mv;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  ChVector<double> v;
  shared_ptr<chrono::fea::ChElementBeamEuler> element;
  ChMatrix33<double> mrot;
  value_type local_268;
  value_type local_258;
  ChVector<double> *local_240;
  element_type *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  undefined8 local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  undefined8 local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_210;
  shared_ptr<chrono::fea::ChElementBase> local_208;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_1f8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_1e8;
  long local_1d8;
  double local_1d0;
  shared_ptr<chrono::fea::ChBeamSectionEuler> *local_1c8;
  ChBuilderBeamEuler *local_1c0;
  _func_int **local_1b8;
  ChVector<double> *local_1b0;
  ChVector<double> local_1a8;
  ChFrame<double> local_188;
  ChFrame<double> local_100;
  ChMatrix33<double> local_78;
  
  local_1c8 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_1c0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  dVar29 = B->m_data[0] - A->m_data[0];
  auVar15 = vsubpd_avx(*(undefined1 (*) [16])(B->m_data + 1),*(undefined1 (*) [16])(A->m_data + 1));
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  uVar4 = vcmppd_avx512vl(auVar15,ZEXT816(0) << 0x40,0);
  if ((byte)((byte)(uVar4 & 3) & dVar29 == 0.0 & (byte)((uVar4 & 3) >> 1)) == 0) {
    dVar21 = auVar15._0_8_;
    auVar15 = vshufpd_avx(auVar15,auVar15,1);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar21 * dVar21;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar29;
    auVar14 = vfmadd231sd_fma(auVar16,auVar17,auVar17);
    auVar14 = vfmadd231sd_fma(auVar14,auVar15,auVar15);
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    bVar8 = 2.2250738585072014e-308 <= auVar14._0_8_;
    dVar25 = 1.0 / auVar14._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (ulong)bVar8 * (long)(auVar15._0_8_ * dVar25);
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)((ulong)bVar8 * (long)(dVar21 * dVar25));
    auVar15._0_8_ = (ulong)bVar8 * (long)(dVar29 * dVar25) + (ulong)!bVar8 * 0x3ff0000000000000;
    auVar15._8_8_ = 0;
  }
  else {
    auVar15 = ZEXT816(0x3ff0000000000000);
    auVar14 = ZEXT816(0) << 0x40;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = Ydir->m_data[2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = Ydir->m_data[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = Ydir->m_data[1];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar15._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar14._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       Ydir->m_data[2] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar16 = vfmsub231sd_fma(auVar26,auVar14,auVar35);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       Ydir->m_data[1] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar17 = vfmsub231sd_fma(auVar22,auVar9,auVar30);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar17._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       Ydir->m_data[0] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar18 = vfmsub231sd_fma(auVar18,auVar15,auVar33);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar18._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar16._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar16 = vfmadd231sd_fma(auVar37,auVar17,auVar17);
  auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar18);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  dVar29 = auVar16._0_8_;
  if (0.0001 <= dVar29) goto LAB_005dfd60;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar16 = vandpd_avx512vl(auVar35,auVar5);
  if (0.9 <= auVar16._0_8_) {
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar16 = vandpd_avx512vl(auVar33,auVar6);
    if (0.9 <= auVar16._0_8_) {
      auVar7._8_8_ = 0x7fffffffffffffff;
      auVar7._0_8_ = 0x7fffffffffffffff;
      auVar16 = vandpd_avx512vl(auVar30,auVar7);
      auVar17 = ZEXT816(0);
      if (0.9 <= auVar16._0_8_) goto LAB_005dfd2a;
      auVar16 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar17 = ZEXT816(0x3ff0000000000000);
LAB_005dfd2a:
      auVar16 = ZEXT816(0);
    }
    auVar18 = ZEXT816(0);
  }
  else {
    auVar18 = ZEXT816(0x3ff0000000000000);
    auVar16 = ZEXT816(0);
    auVar17 = ZEXT816(0);
  }
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       auVar16._0_8_ *
       -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar22 = vfmadd231sd_fma(auVar27,auVar14,auVar18);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       auVar17._0_8_ *
       -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar16 = vfmadd231sd_fma(auVar23,auVar9,auVar16);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar16._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       auVar18._0_8_ *
       -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar17 = vfmadd231sd_fma(auVar19,auVar15,auVar17);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar17._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar22._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar16 = vfmadd231sd_fma(auVar31,auVar16,auVar16);
  auVar16 = vfmadd231sd_fma(auVar16,auVar17,auVar17);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  dVar29 = auVar16._0_8_;
LAB_005dfd60:
  dVar29 = 1.0 / dVar29;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar29;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar29;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar29;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar14 = vfmsub231sd_fma(auVar32,auVar28,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar15 = vfmsub231sd_fma(auVar34,auVar20,auVar15);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar16 = vfmsub231sd_fma(auVar36,auVar24,auVar9);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar14._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar15._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar16._0_8_;
  local_240 = A;
  local_1b0 = B;
  ChFrame<double>::ChFrame(&local_100,A,&local_78);
  pCVar10 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)A);
  local_188._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_1b8 = (_func_int **)&PTR__ChFrame_00b03780;
  local_188.coord.pos.m_data[0] = local_100.coord.pos.m_data[0];
  local_188.coord.pos.m_data[1] = local_100.coord.pos.m_data[1];
  local_188.coord.pos.m_data[2] = local_100.coord.pos.m_data[2];
  local_188.coord.rot.m_data[0] = local_100.coord.rot.m_data[0];
  local_188.coord.rot.m_data[1] = local_100.coord.rot.m_data[1];
  local_188.coord.rot.m_data[2] = local_100.coord.rot.m_data[2];
  local_188.coord.rot.m_data[3] = local_100.coord.rot.m_data[3];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar10,&local_188);
  local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
            (&local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pCVar10);
  pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1e8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ChNodeFEAbase;
  local_1e8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(pCVar2,&local_1e8);
  if (local_1e8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,&local_258);
  if (0 < N) {
    local_1d0 = (double)N;
    local_1d8 = (ulong)(uint)N << 4;
    iVar13 = 1;
    lVar12 = 0;
    do {
      auVar15 = *(undefined1 (*) [16])local_240->m_data;
      dVar29 = (double)iVar13 / local_1d0;
      auVar14 = vsubpd_avx(*(undefined1 (*) [16])local_1b0->m_data,auVar15);
      local_1a8.m_data[2] =
           local_240->m_data[2] + dVar29 * (local_1b0->m_data[2] - local_240->m_data[2]);
      local_1a8.m_data[0] = auVar15._0_8_ + dVar29 * auVar14._0_8_;
      local_1a8.m_data[1] = auVar15._8_8_ + dVar29 * auVar14._8_8_;
      mv = &local_1a8;
      ChFrame<double>::ChFrame(&local_100,mv,&local_78);
      pCVar10 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
      local_188._vptr_ChFrame = local_1b8;
      local_188.coord.pos.m_data[0] = local_100.coord.pos.m_data[0];
      local_188.coord.pos.m_data[1] = local_100.coord.pos.m_data[1];
      local_188.coord.pos.m_data[2] = local_100.coord.pos.m_data[2];
      local_188.coord.rot.m_data[0] = local_100.coord.rot.m_data[0];
      local_188.coord.rot.m_data[1] = local_100.coord.rot.m_data[1];
      local_188.coord.rot.m_data[2] = local_100.coord.rot.m_data[2];
      local_188.coord.rot.m_data[3] = local_100.coord.rot.m_data[3];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar10,&local_188);
      local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = pCVar10;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_268.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pCVar10);
      pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_268.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_268.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar2,&local_1f8);
      if (local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,&local_268);
      local_188._vptr_ChFrame = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamEuler,std::allocator<chrono::fea::ChElementBeamEuler>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188.coord,
                 (ChElementBeamEuler **)&local_188,
                 (allocator<chrono::fea::ChElementBeamEuler> *)&local_100);
      pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_208.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_188._vptr_ChFrame;
      local_208.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar2,&local_208);
      if (local_208.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
      ::push_back(&local_1c0->beam_elems,(value_type *)&local_188);
      psVar11 = (this_00->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(psVar11->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar12);
      local_218 = *puVar1;
      p_Stack_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar3 = *(long *)((long)&(psVar11->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               )._M_refcount._M_pi + lVar12);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
          psVar11 = (this_00->
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      puVar1 = (undefined8 *)
               ((long)&psVar11[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar12);
      local_228 = *puVar1;
      p_Stack_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar3 = *(long *)((long)&psVar11[1].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + lVar12);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      (*(*(_func_int ***)local_188._vptr_ChFrame)[0x1a])
                (local_188._vptr_ChFrame,&local_218,&local_228);
      if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_220);
      }
      if (p_Stack_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_210);
      }
      local_238 = (local_1c8->
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      local_230._M_pi =
           (local_1c8->
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_230._M_pi)->_M_use_count = (local_230._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_230._M_pi)->_M_use_count = (local_230._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)(local_188._vptr_ChFrame + 0x1a))->_vptr_ChElementBase =
           (_func_int **)local_238;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188._vptr_ChFrame + 0x1b),
                 &local_230);
      if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0]);
      }
      if (local_268.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar13 = iVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (local_1d8 != lVar12);
  }
  if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChBuilderBeamEuler::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionEuler> sect,     // section material for beam elements
                                   const int N,                                  // number of elements in the segment
                                   const ChVector<> A,                           // starting point
                                   const ChVector<> B,                           // ending point
                                   const ChVector<> Ydir                         // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(A, mrot));
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        element->SetSection(sect);
    }
}